

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

int Acb_ObjAlloc(Acb_Ntk_t *p,Acb_ObjType_t Type,int nFans,int nFons)

{
  int i;
  Vec_Que_t *pVVar1;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  int Entry;
  Vec_Int_t *p_00;
  uint uVar7;
  int iVar8;
  
  i = (p->vObjType).nSize;
  Vec_StrPush(&p->vObjType,(char)Type);
  iVar8 = -1;
  iVar2 = iVar8;
  if (Type == ABC_OPER_CO) {
    if (nFans != 1) {
      __assert_fail("nFans == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x1da,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
    }
    p_00 = &p->vCos;
    iVar2 = (p->vCos).nSize;
  }
  else {
    if (Type != ABC_OPER_CI) {
      iVar5 = Acb_ObjIsBox(p,i);
      iVar6 = iVar5 + nFans;
      if (iVar5 + nFans <= p->nFaninMax) {
        iVar6 = p->nFaninMax;
      }
      goto LAB_00322f1b;
    }
    if (nFans != 0) {
      __assert_fail("nFans == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x1d3,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
    }
    p_00 = &p->vCis;
    iVar2 = (p->vCis).nSize;
  }
  Vec_IntPush(p_00,i);
  iVar6 = 2;
LAB_00322f1b:
  Vec_IntPush(&p->vObjFans,(p->vFanSto).nSize);
  iVar5 = 0;
  Vec_IntPush(&p->vFanSto,0);
  if (iVar2 < 0) {
    iVar2 = iVar8;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    Entry = iVar8;
    if (iVar5 == 1) {
      Entry = iVar2;
    }
    Vec_IntPush(&p->vFanSto,Entry);
  }
  iVar2 = Acb_ObjIsBox(p,i);
  if (iVar2 != 0) {
    __assert_fail("!Acb_ObjIsBox(p, iObj) || nFons > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x1e7,"int Acb_ObjAlloc(Acb_Ntk_t *, Acb_ObjType_t, int, int)");
  }
  if (0 < (p->vObjCopy).nSize) {
    Vec_IntPush(&p->vObjCopy,-1);
  }
  if (0 < (p->vObjFunc).nSize) {
    Vec_IntPush(&p->vObjFunc,-1);
  }
  if (0 < (p->vObjWeight).nSize) {
    Vec_IntPush(&p->vObjWeight,0);
  }
  uVar3 = (p->vObjTruth).nSize;
  if (0 < (int)uVar3) {
    if (uVar3 == (p->vObjTruth).nCap) {
      iVar2 = uVar3 * 2;
      if (uVar3 < 0x10) {
        iVar2 = 0x10;
      }
      Vec_WrdGrow(&p->vObjTruth,iVar2);
      uVar3 = (p->vObjTruth).nSize;
    }
    (p->vObjTruth).nSize = uVar3 + 1;
    (p->vObjTruth).pArray[(int)uVar3] = 0;
  }
  if (0 < (p->vObjName).nSize) {
    Vec_IntPush(&p->vObjName,0);
  }
  if (0 < (p->vObjRange).nSize) {
    Vec_IntPush(&p->vObjRange,0);
  }
  if (0 < (p->vObjTrav).nSize) {
    Vec_IntPush(&p->vObjTrav,0);
  }
  if (0 < (p->vObjAttr).nSize) {
    Vec_IntPush(&p->vObjAttr,0);
  }
  if (0 < (p->vLevelD).nSize) {
    Vec_IntPush(&p->vLevelD,0);
  }
  if (0 < (p->vLevelR).nSize) {
    Vec_IntPush(&p->vLevelR,0);
  }
  if (0 < (p->vPathD).nSize) {
    Vec_IntPush(&p->vPathD,0);
  }
  if (0 < (p->vPathR).nSize) {
    Vec_IntPush(&p->vPathR,0);
  }
  uVar3 = (p->vCounts).nSize;
  if (0 < (int)uVar3) {
    if (uVar3 == (p->vCounts).nCap) {
      uVar7 = uVar3 * 2;
      if (uVar3 < 0x10) {
        uVar7 = 0x10;
      }
      if ((int)uVar3 < (int)uVar7) {
        pfVar4 = (p->vCounts).pArray;
        if (pfVar4 == (float *)0x0) {
          pfVar4 = (float *)malloc((ulong)uVar7 << 2);
        }
        else {
          pfVar4 = (float *)realloc(pfVar4,(ulong)uVar7 << 2);
          uVar3 = (p->vCounts).nSize;
        }
        (p->vCounts).pArray = pfVar4;
        (p->vCounts).nCap = uVar7;
      }
    }
    (p->vCounts).nSize = uVar3 + 1;
    (p->vCounts).pArray[(int)uVar3] = 0.0;
  }
  if (0 < (p->vFanouts).nSize) {
    Vec_WecPushLevel(&p->vFanouts);
  }
  if (0 < (p->vCnfs).nSize) {
    Vec_WecPushLevel(&p->vCnfs);
  }
  pVVar1 = p->vQue;
  if (pVVar1 != (Vec_Que_t *)0x0) {
    if (pVVar1->pCostsFlt != (float **)0x0) {
      __assert_fail("p->pCostsFlt == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
    }
    pVVar1->pCostsFlt = &(p->vCounts).pArray;
  }
  return i;
}

Assistant:

static inline int Acb_ObjAlloc( Acb_Ntk_t * p, Acb_ObjType_t Type, int nFans, int nFons )
{
    int i, nFansReal, CioId = -1, iObj = Vec_StrSize(&p->vObjType);
    Vec_StrPush( &p->vObjType, (char)Type );
    if ( Type == ABC_OPER_CI )
    {
        assert( nFans == 0 );
        CioId = Vec_IntSize( &p->vCis );
        Vec_IntPush( &p->vCis, iObj );
        nFansReal = 2;
    }
    else if ( Type == ABC_OPER_CO )
    {
        assert( nFans == 1 );
        CioId = Vec_IntSize( &p->vCos );
        Vec_IntPush( &p->vCos, iObj );
        nFansReal = 2;
    }
    else 
        nFansReal = Abc_MaxInt( nFans + Acb_ObjIsBox(p, iObj), p->nFaninMax );
    // add fins
    Vec_IntPush( &p->vObjFans, Vec_IntSize(&p->vFanSto) );
    Vec_IntPush( &p->vFanSto, 0 );
    for ( i = 0; i < nFansReal; i++ )
        Vec_IntPush( &p->vFanSto, (CioId >= 0 && i == 1) ? CioId : -1 );
    // add fons
    assert( !Acb_ObjIsBox(p, iObj) || nFons > 0 );
    for ( i = 0; i < nFons; i++ )
        Acb_ObjAddFanin( p, Acb_ObjAlloc(p, ABC_OPER_FON, 1, 0), iObj );
    // extend storage
    if ( Acb_NtkHasObjCopies(p) ) Vec_IntPush(&p->vObjCopy  , -1);
    if ( Acb_NtkHasObjFuncs(p)  ) Vec_IntPush(&p->vObjFunc  , -1);
    if ( Acb_NtkHasObjWeights(p)) Vec_IntPush(&p->vObjWeight,  0);
    if ( Acb_NtkHasObjTruths(p) ) Vec_WrdPush(&p->vObjTruth ,  0);
    if ( Acb_NtkHasObjNames(p)  ) Vec_IntPush(&p->vObjName  ,  0);
    if ( Acb_NtkHasObjRanges(p) ) Vec_IntPush(&p->vObjRange ,  0);
    if ( Acb_NtkHasObjTravs(p)  ) Vec_IntPush(&p->vObjTrav  ,  0);
    if ( Acb_NtkHasObjAttrs(p)  ) Vec_IntPush(&p->vObjAttr  ,  0);
    if ( Acb_NtkHasObjLevelD(p) ) Vec_IntPush(&p->vLevelD   ,  0);
    if ( Acb_NtkHasObjLevelR(p) ) Vec_IntPush(&p->vLevelR   ,  0);
    if ( Acb_NtkHasObjPathD(p)  ) Vec_IntPush(&p->vPathD    ,  0);
    if ( Acb_NtkHasObjPathR(p)  ) Vec_IntPush(&p->vPathR    ,  0);
    if ( Acb_NtkHasObjCounts(p) ) Vec_FltPush(&p->vCounts   ,  0);
    if ( Acb_NtkHasObjFanout(p) ) Vec_WecPushLevel(&p->vFanouts);
    if ( Acb_NtkHasObjCnfs(p)   ) Vec_WecPushLevel(&p->vCnfs);
    if ( p->vQue ) Vec_QueSetPriority( p->vQue, Vec_FltArrayP(&p->vCounts) );
    return iObj;
}